

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

int read_data_compressed(archive_read *a,void **buff,size_t *size,int64_t *offset,size_t looper)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  int local_70;
  int i;
  int length;
  int lzss_offset;
  int code;
  int sym;
  int ret;
  size_t bs;
  int64_t end;
  int64_t start;
  rar *rar;
  size_t looper_local;
  int64_t *offset_local;
  size_t *size_local;
  void **buff_local;
  archive_read *a_local;
  
  rar = (rar *)(looper + 1);
  if (looper < 0x401) {
    code = 0;
    start = (int64_t)a->format->data;
    looper_local = (size_t)offset;
    offset_local = (int64_t *)size;
    size_local = (size_t *)buff;
    buff_local = (void **)a;
    do {
      if (*(char *)(start + 0xd0) == '\0') {
        return -0x1e;
      }
      if (*(long *)(start + 0x3c8) != 0) {
        if (*(int *)(start + 0xd4) == 0) {
          *size_local = *(size_t *)(start + 0x3c0);
          *offset_local = *(int64_t *)(start + 0x3c8);
          *(int64_t *)(start + 0xb8) = *offset_local + *(long *)(start + 0xb8);
          *(undefined8 *)looper_local = *(undefined8 *)(start + 0xc0);
          *(int64_t *)(start + 0xc0) = *offset_local + *(long *)(start + 0xc0);
          *(long *)(start + 0x3c8) = *(long *)(start + 0x3c8) - *offset_local;
          *(int64_t *)(start + 0x3c0) = *offset_local + *(long *)(start + 0x3c0);
        }
        else {
          *size_local = *(size_t *)(start + 0xe0);
          *offset_local = (ulong)*(uint *)(start + 0xd4);
          *(undefined4 *)(start + 0xd4) = 0;
          *(undefined8 *)looper_local = *(undefined8 *)(start + 0xc0);
          *(int64_t *)(start + 0xc0) = *offset_local + *(long *)(start + 0xc0);
        }
        goto LAB_002a9d33;
      }
      if ((*(char *)(start + 0x3d1) != '\0') ||
         ((*(int *)(start + 0xe8) != 0 && (*(long *)(start + 0x28) <= *(long *)(start + 0xb8))))) {
        if (*(int *)(start + 0xd4) != 0) {
          *size_local = *(size_t *)(start + 0xe0);
          *offset_local = (ulong)*(uint *)(start + 0xd4);
          *(undefined8 *)looper_local = *(undefined8 *)(start + 0xc0);
          *(int64_t *)(start + 0xc0) = *offset_local + *(long *)(start + 0xc0);
          uVar3 = crc32(*(undefined8 *)(start + 0xf0),*size_local,*offset_local & 0xffffffff);
          *(undefined8 *)(start + 0xf0) = uVar3;
          *(undefined4 *)(start + 0xd4) = 0;
          return 0;
        }
        *size_local = 0;
        *offset_local = 0;
        *(undefined8 *)looper_local = *(undefined8 *)(start + 0xb8);
        if (*(long *)(start + 8) != *(long *)(start + 0xf0)) {
          archive_set_error((archive *)buff_local,0x54,"File CRC error");
          return -0x1e;
        }
        *(undefined1 *)(start + 0xed) = 1;
        return 1;
      }
      if (((*(char *)(start + 0x3d2) == '\0') && (*(int *)(start + 0xe8) != 0)) &&
         (0 < *(long *)(start + 0xb0))) {
        if ((long)(ulong)(uint)(*(int *)(start + 0xd8) - *(int *)(start + 0xd4)) <
            *(long *)(start + 0xb0)) {
          _sym = (size_t)(uint)(*(int *)(start + 0xd8) - *(int *)(start + 0xd4));
        }
        else {
          _sym = *(size_t *)(start + 0xb0);
        }
        iVar1 = copy_from_lzss_window_to_unp
                          ((archive_read *)buff_local,(void **)size_local,*(int64_t *)(start + 0xb8)
                           ,_sym);
        if (iVar1 != 0) {
          return iVar1;
        }
        *(size_t *)(start + 0xb8) = _sym + *(long *)(start + 0xb8);
        *(size_t *)(start + 0xb0) = *(long *)(start + 0xb0) - _sym;
        code = 0;
        if (*size_local != 0) {
          *(undefined4 *)(start + 0xd4) = 0;
          *offset_local = (ulong)*(uint *)(start + 0xd8);
          *(undefined8 *)looper_local = *(undefined8 *)(start + 0xc0);
          *(int64_t *)(start + 0xc0) = *offset_local + *(long *)(start + 0xc0);
          uVar3 = crc32(*(undefined8 *)(start + 0xf0),*size_local,*offset_local & 0xffffffff);
          *(undefined8 *)(start + 0xf0) = uVar3;
          return 0;
        }
      }
      else if (*(long *)(start + 0x3b8) == *(long *)(start + 0x3a8)) {
        iVar1 = run_filters((archive_read *)buff_local);
        if (iVar1 == 0) {
          return -0x1e;
        }
      }
      else {
        if ((*(long *)(start + 0x4f48) == 0) &&
           (code = rar_br_preparation((archive_read *)buff_local,(rar_br *)(start + 0x4f30)),
           code < -0x14)) {
          return code;
        }
        if ((*(char *)(start + 0x388) != '\0') &&
           (code = parse_codes((archive_read *)buff_local), code < -0x14)) {
          return code;
        }
        if (*(char *)(start + 0x3d2) == '\0') {
          end = *(long *)(start + 0xb8);
          bs = end + (ulong)*(uint *)(start + 0xe8);
          if (0x104 < *(uint *)(start + 0xe8)) {
            bs = bs - 0x104;
          }
          if (*(long *)(start + 0x3a8) < (long)bs) {
            bs = *(size_t *)(start + 0x3a8);
          }
          iVar1 = expand((archive_read *)buff_local,(int64_t *)&bs);
          if (iVar1 != 0) {
            return iVar1;
          }
          *(size_t *)(start + 0xb0) = bs - end;
          *(size_t *)(start + 0x3b8) = bs;
          if ((*(long *)(start + 0x3b8) != *(long *)(start + 0x3a8)) &&
             (*(long *)(start + 0xb0) == 0)) {
            archive_set_error((archive *)buff_local,0x54,"Internal error extracting RAR file");
            return -0x1e;
          }
        }
        else {
          iVar1 = Ppmd7_DecodeSymbol((CPpmd7 *)(start + 0x3d8),(IPpmd7_RangeDec *)(start + 0x4ec8));
          if (iVar1 < 0) {
            archive_set_error((archive *)buff_local,0x54,"Invalid symbol");
            return -0x1e;
          }
          if (iVar1 == *(int *)(start + 0x3d4)) {
            iVar2 = Ppmd7_DecodeSymbol((CPpmd7 *)(start + 0x3d8),(IPpmd7_RangeDec *)(start + 0x4ec8)
                                      );
            if (iVar2 < 0) {
              archive_set_error((archive *)buff_local,0x54,"Invalid symbol");
              return -0x1e;
            }
            switch(iVar2) {
            case 0:
              *(undefined1 *)(start + 0x388) = 1;
              iVar1 = read_data_compressed
                                ((archive_read *)buff_local,(void **)size_local,
                                 (size_t *)offset_local,(int64_t *)looper_local,(size_t)rar);
              return iVar1;
            default:
              lzss_emit_literal((rar *)start,(uint8_t)iVar1);
              *(long *)(start + 0xb0) = *(long *)(start + 0xb0) + 1;
              break;
            case 2:
              *(undefined1 *)(start + 0x3d1) = 1;
              goto LAB_002a9cd9;
            case 3:
              archive_set_error((archive *)buff_local,-1,"Parsing filters is unsupported.");
              return -0x19;
            case 4:
              i = 0;
              for (local_70 = 2; -1 < local_70; local_70 = local_70 + -1) {
                iVar1 = Ppmd7_DecodeSymbol((CPpmd7 *)(start + 0x3d8),
                                           (IPpmd7_RangeDec *)(start + 0x4ec8));
                if (iVar1 < 0) {
                  archive_set_error((archive *)buff_local,0x54,"Invalid symbol");
                  return -0x1e;
                }
                i = iVar1 << ((byte)(local_70 << 3) & 0x1f) | i;
              }
              iVar1 = Ppmd7_DecodeSymbol((CPpmd7 *)(start + 0x3d8),
                                         (IPpmd7_RangeDec *)(start + 0x4ec8));
              if (iVar1 < 0) {
                archive_set_error((archive *)buff_local,0x54,"Invalid symbol");
                return -0x1e;
              }
              lzss_emit_match((rar *)start,i + 2,iVar1 + 0x20);
              *(long *)(start + 0xb0) = (long)(iVar1 + 0x20) + *(long *)(start + 0xb0);
              break;
            case 5:
              iVar1 = Ppmd7_DecodeSymbol((CPpmd7 *)(start + 0x3d8),
                                         (IPpmd7_RangeDec *)(start + 0x4ec8));
              if (iVar1 < 0) {
                archive_set_error((archive *)buff_local,0x54,"Invalid symbol");
                return -0x1e;
              }
              lzss_emit_match((rar *)start,1,iVar1 + 4);
              *(long *)(start + 0xb0) = (long)(iVar1 + 4) + *(long *)(start + 0xb0);
            }
          }
          else {
            lzss_emit_literal((rar *)start,(uint8_t)iVar1);
            *(long *)(start + 0xb0) = *(long *)(start + 0xb0) + 1;
          }
        }
        if ((long)(ulong)(uint)(*(int *)(start + 0xd8) - *(int *)(start + 0xd4)) <
            *(long *)(start + 0xb0)) {
          _sym = (size_t)(uint)(*(int *)(start + 0xd8) - *(int *)(start + 0xd4));
        }
        else {
          _sym = *(size_t *)(start + 0xb0);
        }
        iVar1 = copy_from_lzss_window_to_unp
                          ((archive_read *)buff_local,(void **)size_local,*(int64_t *)(start + 0xb8)
                           ,_sym);
        if (iVar1 != 0) {
          return iVar1;
        }
        *(size_t *)(start + 0xb8) = _sym + *(long *)(start + 0xb8);
        *(size_t *)(start + 0xb0) = *(long *)(start + 0xb0) - _sym;
        code = 0;
      }
LAB_002a9cd9:
    } while (*size_local == 0);
    *(undefined4 *)(start + 0xd4) = 0;
    *offset_local = (ulong)*(uint *)(start + 0xd8);
    *(undefined8 *)looper_local = *(undefined8 *)(start + 0xc0);
    *(int64_t *)(start + 0xc0) = *offset_local + *(long *)(start + 0xc0);
LAB_002a9d33:
    uVar3 = crc32(*(undefined8 *)(start + 0xf0),*size_local,*offset_local & 0xffffffff);
    *(undefined8 *)(start + 0xf0) = uVar3;
    a_local._4_4_ = code;
  }
  else {
    a_local._4_4_ = -0x1e;
  }
  return a_local._4_4_;
}

Assistant:

static int
read_data_compressed(struct archive_read *a, const void **buff, size_t *size,
                     int64_t *offset, size_t looper)
{
  if (looper++ > MAX_COMPRESS_DEPTH)
    return (ARCHIVE_FATAL);

  struct rar *rar;
  int64_t start, end;
  size_t bs;
  int ret = (ARCHIVE_OK), sym, code, lzss_offset, length, i;

  rar = (struct rar *)(a->format->data);

  do {
    if (!rar->valid)
      return (ARCHIVE_FATAL);

    if (rar->filters.bytes_ready > 0)
    {
      /* Flush unp_buffer first */
      if (rar->unp_offset > 0)
      {
        *buff = rar->unp_buffer;
        *size = rar->unp_offset;
        rar->unp_offset = 0;
        *offset = rar->offset_outgoing;
        rar->offset_outgoing += *size;
      }
      else
      {
        *buff = rar->filters.bytes;
        *size = rar->filters.bytes_ready;

        rar->offset += *size;
        *offset = rar->offset_outgoing;
        rar->offset_outgoing += *size;

        rar->filters.bytes_ready -= *size;
        rar->filters.bytes += *size;
      }
      goto ending_block;
    }

    if (rar->ppmd_eod ||
       (rar->dictionary_size && rar->offset >= rar->unp_size))
    {
      if (rar->unp_offset > 0) {
        /*
         * We have unprocessed extracted data. write it out.
         */
        *buff = rar->unp_buffer;
        *size = rar->unp_offset;
        *offset = rar->offset_outgoing;
        rar->offset_outgoing += *size;
        /* Calculate File CRC. */
        rar->crc_calculated = crc32(rar->crc_calculated, *buff,
          (unsigned)*size);
        rar->unp_offset = 0;
        return (ARCHIVE_OK);
      }
      *buff = NULL;
      *size = 0;
      *offset = rar->offset;
      if (rar->file_crc != rar->crc_calculated) {
#ifndef DONT_FAIL_ON_CRC_ERROR
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                          "File CRC error");
        return (ARCHIVE_FATAL);
#endif
      }
      rar->entry_eof = 1;
      return (ARCHIVE_EOF);
    }

    if (!rar->is_ppmd_block && rar->dictionary_size && rar->bytes_uncopied > 0)
    {
      if (rar->bytes_uncopied > (rar->unp_buffer_size - rar->unp_offset))
        bs = rar->unp_buffer_size - rar->unp_offset;
      else
        bs = (size_t)rar->bytes_uncopied;
      ret = copy_from_lzss_window_to_unp(a, buff, rar->offset, bs);
      if (ret != ARCHIVE_OK)
        return (ret);
      rar->offset += bs;
      rar->bytes_uncopied -= bs;
      if (*buff != NULL) {
        rar->unp_offset = 0;
        *size = rar->unp_buffer_size;
        *offset = rar->offset_outgoing;
        rar->offset_outgoing += *size;
        /* Calculate File CRC. */
        rar->crc_calculated = crc32(rar->crc_calculated, *buff,
          (unsigned)*size);
        return (ret);
      }
      continue;
    }

    if (rar->filters.lastend == rar->filters.filterstart)
    {
      if (!run_filters(a))
        return (ARCHIVE_FATAL);
      continue;
    }

    if (!rar->br.next_in &&
      (ret = rar_br_preparation(a, &(rar->br))) < ARCHIVE_WARN)
      return (ret);
    if (rar->start_new_table && ((ret = parse_codes(a)) < (ARCHIVE_WARN)))
      return (ret);

    if (rar->is_ppmd_block)
    {
      if ((sym = __archive_ppmd7_functions.Ppmd7_DecodeSymbol(
        &rar->ppmd7_context, &rar->range_dec.p)) < 0)
      {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                          "Invalid symbol");
        return (ARCHIVE_FATAL);
      }
      if(sym != rar->ppmd_escape)
      {
        lzss_emit_literal(rar, sym);
        rar->bytes_uncopied++;
      }
      else
      {
        if ((code = __archive_ppmd7_functions.Ppmd7_DecodeSymbol(
          &rar->ppmd7_context, &rar->range_dec.p)) < 0)
        {
          archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                            "Invalid symbol");
          return (ARCHIVE_FATAL);
        }

        switch(code)
        {
          case 0:
            rar->start_new_table = 1;
            return read_data_compressed(a, buff, size, offset, looper);

          case 2:
            rar->ppmd_eod = 1;/* End Of ppmd Data. */
            continue;

          case 3:
            archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
                              "Parsing filters is unsupported.");
            return (ARCHIVE_FAILED);

          case 4:
            lzss_offset = 0;
            for (i = 2; i >= 0; i--)
            {
              if ((code = __archive_ppmd7_functions.Ppmd7_DecodeSymbol(
                &rar->ppmd7_context, &rar->range_dec.p)) < 0)
              {
                archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                                  "Invalid symbol");
                return (ARCHIVE_FATAL);
              }
              lzss_offset |= code << (i * 8);
            }
            if ((length = __archive_ppmd7_functions.Ppmd7_DecodeSymbol(
              &rar->ppmd7_context, &rar->range_dec.p)) < 0)
            {
              archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                                "Invalid symbol");
              return (ARCHIVE_FATAL);
            }
            lzss_emit_match(rar, lzss_offset + 2, length + 32);
            rar->bytes_uncopied += length + 32;
            break;

          case 5:
            if ((length = __archive_ppmd7_functions.Ppmd7_DecodeSymbol(
              &rar->ppmd7_context, &rar->range_dec.p)) < 0)
            {
              archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                                "Invalid symbol");
              return (ARCHIVE_FATAL);
            }
            lzss_emit_match(rar, 1, length + 4);
            rar->bytes_uncopied += length + 4;
            break;

         default:
           lzss_emit_literal(rar, sym);
           rar->bytes_uncopied++;
        }
      }
    }
    else
    {
      start = rar->offset;
      end = start + rar->dictionary_size;

      /* We don't want to overflow the window and overwrite data that we write
       * at 'start'. Therefore, reduce the end length by the maximum match size,
       * which is 260 bytes. You can compute this maximum by looking at the
       * definition of 'expand', in particular when 'symbol >= 271'. */
      /* NOTE: It's possible for 'dictionary_size' to be less than this 260
       * value, however that will only be the case when 'unp_size' is small,
       * which should only happen when the entry size is small and there's no
       * risk of overflowing the buffer */
      if (rar->dictionary_size > 260) {
        end -= 260;
      }

      if (rar->filters.filterstart < end) {
        end = rar->filters.filterstart;
      }

      ret = expand(a, &end);
      if (ret != ARCHIVE_OK)
	      return (ret);

      rar->bytes_uncopied = end - start;
      rar->filters.lastend = end;
      if (rar->filters.lastend != rar->filters.filterstart && rar->bytes_uncopied == 0) {
          /* Broken RAR files cause this case.
          * NOTE: If this case were possible on a normal RAR file
          * we would find out where it was actually bad and
          * what we would do to solve it. */
          archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                            "Internal error extracting RAR file");
          return (ARCHIVE_FATAL);
      }
    }
    if (rar->bytes_uncopied > (rar->unp_buffer_size - rar->unp_offset))
      bs = rar->unp_buffer_size - rar->unp_offset;
    else
      bs = (size_t)rar->bytes_uncopied;
    ret = copy_from_lzss_window_to_unp(a, buff, rar->offset, bs);
    if (ret != ARCHIVE_OK)
      return (ret);
    rar->offset += bs;
    rar->bytes_uncopied -= bs;
    /*
     * If *buff is NULL, it means unp_buffer is not full.
     * So we have to continue extracting a RAR file.
     */
  } while (*buff == NULL);

  rar->unp_offset = 0;
  *size = rar->unp_buffer_size;
  *offset = rar->offset_outgoing;
  rar->offset_outgoing += *size;
ending_block:
  /* Calculate File CRC. */
  rar->crc_calculated = crc32(rar->crc_calculated, *buff, (unsigned)*size);
  return ret;
}